

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::eval_greaterThan_vec2(ShaderEvalContext *c)

{
  float *pfVar1;
  ulong uVar2;
  int i;
  long lVar3;
  Vector<bool,_2> res;
  Vector<float,_2> res_1;
  float local_20 [2];
  ulong local_18;
  int local_8 [2];
  
  local_20[0] = c->in[0].m_data[3];
  local_20[1] = c->in[0].m_data[1];
  uVar2 = *(ulong *)c->in[1].m_data;
  local_18 = uVar2 << 0x20 | uVar2 >> 0x20;
  res.m_data[0] = false;
  res.m_data[1] = false;
  lVar3 = 0;
  do {
    pfVar1 = (float *)((long)&local_18 + lVar3 * 4);
    res.m_data[lVar3] = *pfVar1 <= local_20[lVar3] && local_20[lVar3] != *pfVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = (float)(int)res.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar3 = 0;
  do {
    (c->color).m_data[local_8[lVar3]] = res_1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }